

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

void poptSetExecPath(poptContext con,char *path,int allowAbsolute)

{
  char *pcVar1;
  size_t sVar2;
  int allowAbsolute_local;
  char *path_local;
  poptContext con_local;
  
  pcVar1 = (char *)_free(con->execPath);
  con->execPath = pcVar1;
  sVar2 = strlen(path);
  pcVar1 = (char *)malloc(sVar2 + 1);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strcpy(pcVar1,path);
    con->execPath = pcVar1;
    con->execAbsolute = allowAbsolute;
    return;
  }
  fprintf(_stderr,"virtual memory exhausted.\n");
  exit(1);
}

Assistant:

void poptSetExecPath(poptContext con, const char * path, int allowAbsolute)
{
    con->execPath = _free(con->execPath);
    con->execPath = xstrdup(path);
    con->execAbsolute = allowAbsolute;
    return;
}